

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O1

raplcap_msr_sys_ctx * msr_sys_init(uint32_t *n_pkg,uint32_t *n_die)

{
  size_t __size;
  uint32_t ncpus;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  msr_topology *topo;
  raplcap_msr_sys_ctx *ctx;
  ulong __nmemb;
  uint32_t *__ptr;
  int *piVar5;
  char *__nptr;
  size_t sVar6;
  ulong uVar7;
  int local_84;
  char local_58 [40];
  
  if (n_pkg == (uint32_t *)0x0) {
    __assert_fail("n_pkg",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0xdf,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
  }
  if (n_die != (uint32_t *)0x0) {
    ncpus = get_cpu_count();
    if (ncpus == 0) {
      msr_sys_init_cold_6();
    }
    else {
      __size = (ulong)ncpus * 0xc;
      topo = (msr_topology *)malloc(__size);
      if (topo == (msr_topology *)0x0) {
        msr_sys_init_cold_5();
      }
      else {
        iVar1 = get_topology(topo,ncpus);
        if (iVar1 == 0) {
          qsort(topo,(ulong)ncpus,0xc,cmp_msr_topology_pkg_die);
          ctx = (raplcap_msr_sys_ctx *)malloc(0x18);
          if (ctx == (raplcap_msr_sys_ctx *)0x0) {
            msr_sys_init_cold_4();
          }
          else {
            ctx->n_pkg = topo[ncpus - 1].pkg + 1;
            ctx->n_die = topo[ncpus - 1].die + 1;
            uVar2 = 1;
            if (ncpus != 1) {
              sVar6 = 0xc;
              do {
                uVar3 = 1;
                if (*(int *)((long)&topo->pkg + sVar6) == *(int *)((long)&topo[-1].pkg + sVar6)) {
                  uVar3 = (uint)(*(int *)((long)&topo->die + sVar6) !=
                                *(int *)((long)topo + (sVar6 - 8)));
                }
                uVar2 = uVar2 + uVar3;
                sVar6 = sVar6 + 0xc;
              } while (__size != sVar6);
            }
            ctx->n_fds = uVar2;
            __nmemb = (ulong)uVar2;
            __ptr = (uint32_t *)malloc(__nmemb * 4);
            if (__ptr == (uint32_t *)0x0) {
              msr_sys_init_cold_3();
            }
            else {
              *__ptr = topo->cpu;
              uVar3 = 1;
              if (ncpus != 1) {
                sVar6 = 0xc;
                do {
                  if ((*(int *)((long)&topo->pkg + sVar6) != *(int *)((long)&topo[-1].pkg + sVar6))
                     || (*(int *)((long)&topo->die + sVar6) != *(int *)((long)topo + (sVar6 - 8))))
                  {
                    uVar7 = (ulong)uVar3;
                    uVar3 = uVar3 + 1;
                    __ptr[uVar7] = *(uint32_t *)((long)&topo->cpu + sVar6);
                  }
                  sVar6 = sVar6 + 0xc;
                } while (__size != sVar6);
              }
              if (uVar3 != uVar2) {
                __assert_fail("j == n_cpus_to_open",
                              "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                              ,0xa6,
                              "void get_cpus_to_open(uint32_t *, uint32_t, const msr_topology *, uint32_t)"
                             );
              }
              piVar5 = (int *)calloc(__nmemb,4);
              ctx->fds = piVar5;
              if (piVar5 != (int *)0x0) {
                __nptr = getenv("RAPLCAP_READ_ONLY");
                if (__nptr == (char *)0x0) {
                  iVar1 = 2;
                }
                else {
                  iVar1 = atoi(__nptr);
                  iVar1 = (uint)(iVar1 == 0) * 2;
                }
                if (__nmemb != 0) {
                  uVar7 = 0;
                  do {
                    uVar2 = __ptr[uVar7];
                    snprintf(local_58,0x20,"/dev/cpu/%u/msr_safe",(ulong)uVar2);
                    iVar4 = open(local_58,iVar1);
                    if (iVar4 < 0) {
                      snprintf(local_58,0x20,"/dev/cpu/%u/msr",(ulong)uVar2);
                      iVar4 = open(local_58,iVar1);
                      if (iVar4 < 0) {
                        msr_sys_init_cold_1();
                        iVar4 = local_84;
                      }
                    }
                    piVar5[uVar7] = iVar4;
                    if (iVar4 < 0) {
                      piVar5 = __errno_location();
                      iVar1 = *piVar5;
                      free(__ptr);
                      msr_sys_destroy(ctx);
                      free(topo);
                      *piVar5 = iVar1;
                      return (raplcap_msr_sys_ctx *)0x0;
                    }
                    uVar7 = uVar7 + 1;
                  } while (__nmemb != uVar7);
                }
                free(__ptr);
                free(topo);
                *n_pkg = ctx->n_pkg;
                *n_die = ctx->n_die;
                return ctx;
              }
              msr_sys_init_cold_2();
            }
          }
        }
        else {
          free(topo);
        }
      }
    }
    return (raplcap_msr_sys_ctx *)0x0;
  }
  __assert_fail("n_die",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                ,0xe0,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
}

Assistant:

raplcap_msr_sys_ctx* msr_sys_init(uint32_t* n_pkg, uint32_t* n_die) {
  msr_topology* topo;
  raplcap_msr_sys_ctx* ctx;
  uint32_t* cpus_to_open;
  uint32_t ncpus;
  int err_save;
  assert(n_pkg);
  assert(n_die);
  // need to decide which CPU MSRs to open to cover all RAPL zones
  if ((ncpus = get_cpu_count()) == 0) {
    raplcap_perror(ERROR, "msr_sys_init: get_cpu_count");
    return NULL;
  }
  if ((topo = malloc(ncpus * sizeof(*topo))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    return NULL;
  }
  // get topology for all CPUs, sort by pkg and die, then count unique combinations to determine how many MSRs to open
  if (get_topology(topo, ncpus)) {
    free(topo);
    return NULL;
  }
  qsort(topo, ncpus, sizeof(*topo), cmp_msr_topology_pkg_die);
  if ((ctx = malloc(sizeof(*ctx))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(topo);
    return NULL;
  }
  // assumes homogeneous die configurations across packages
  ctx->n_pkg = topo[ncpus - 1].pkg + 1;
  ctx->n_die = topo[ncpus - 1].die + 1;
  ctx->n_fds = count_unique_pkg_die(topo, ncpus);
  raplcap_log(DEBUG, "msr_sys_init: n_cpus=%"PRIu32", n_pkg=%"PRIu32", n_die=%"PRIu32", n_fds=%"PRIu32"\n",
              ncpus, ctx->n_pkg, ctx->n_die, ctx->n_fds);
  // now determine which CPUs to open MSRs for and do it
  if ((cpus_to_open = malloc(ctx->n_fds * sizeof(uint32_t))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(ctx);
    free(topo);
    return NULL;
  }
  get_cpus_to_open(cpus_to_open, ctx->n_fds, topo, ncpus);
  if ((ctx->fds = calloc(ctx->n_fds, sizeof(int))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: calloc");
    free(cpus_to_open);
    free(ctx);
    free(topo);
    return NULL;
  }
  if (open_msrs(ctx->fds, cpus_to_open, ctx->n_fds)) {
    err_save = errno;
    free(cpus_to_open);
    msr_sys_destroy(ctx);
    free(topo);
    errno = err_save;
    return NULL;
  }
  free(cpus_to_open);
  free(topo);
  *n_pkg = ctx->n_pkg;
  *n_die = ctx->n_die;
  return ctx;
}